

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexerTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1f7a::LexerTest_indentation_Test::TestBody(LexerTest_indentation_Test *this)

{
  StringRef buffer;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  AssertHelper local_3c8;
  Message local_3c0;
  Kind local_3b4;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_20;
  Message local_398;
  uint local_38c;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_19;
  Message local_370;
  uint local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_18;
  Message local_348;
  uint local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_17;
  Message local_320;
  Kind local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_16;
  Message local_2f8;
  uint local_2ec;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar_15;
  Message local_2d0;
  uint local_2c4;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_14;
  Message local_2a8;
  uint local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_13;
  Message local_280;
  Kind local_274;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_12;
  Message local_258;
  uint local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar_11;
  Message local_230;
  uint local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_10;
  Message local_208;
  uint local_1fc;
  undefined1 local_1f8 [8];
  AssertionResult gtest_ar_9;
  Message local_1e0;
  Kind local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_8;
  Message local_1b8;
  uint local_1ac;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_7;
  Message local_190;
  uint local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_6;
  Message local_168;
  uint local_15c;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_5;
  Message local_140;
  Kind local_134;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_4;
  Message local_118;
  uint local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_3;
  Message local_f0;
  uint local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  uint local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  Message local_a0;
  Kind local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar;
  Token tok;
  undefined1 local_58 [8];
  Lexer lexer;
  StringRef input;
  LexerTest_indentation_Test *this_local;
  
  lexer._32_8_ = anon_var_dwarf_3a11;
  sVar2 = strlen("|\n | |");
  tok.line = lexer.mode;
  tok.column = lexer._36_4_;
  buffer.Length = sVar2;
  buffer.Data = (char *)lexer._32_8_;
  llbuild::ninja::Lexer::Lexer((Lexer *)local_58,buffer);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_94 = Pipe;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_90,"ninja::Token::Kind::Pipe","tok.tokenKind",&local_94,(Kind *)&tok)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x62,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  local_bc = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_b8,"1U","tok.length",&local_bc,(uint *)((long)&tok.start + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,99,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_e4 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_e0,"1U","tok.line",&local_e4,&tok.tokenKind);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,100,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_10c = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_108,"0U","tok.column",&local_10c,&tok.length);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x65,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_134 = Newline;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_130,"ninja::Token::Kind::Newline","tok.tokenKind",&local_134,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x69,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_15c = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_158,"1U","tok.length",&local_15c,(uint *)((long)&tok.start + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x6a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  local_184 = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_180,"1U","tok.line",&local_184,&tok.tokenKind);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x6b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  local_1ac = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1a8,"1U","tok.column",&local_1ac,&tok.length);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x6c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_1d4 = Indentation;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_1d0,"ninja::Token::Kind::Indentation","tok.tokenKind",&local_1d4,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x70,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  local_1fc = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1f8,"1U","tok.length",&local_1fc,(uint *)((long)&tok.start + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f8);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x71,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f8);
  local_224 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_220,"2U","tok.line",&local_224,&tok.tokenKind);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x72,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  local_24c = 0;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_248,"0U","tok.column",&local_24c,&tok.length);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x73,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_274 = Pipe;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_270,"ninja::Token::Kind::Pipe","tok.tokenKind",&local_274,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_280);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x77,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  local_29c = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_298,"1U","tok.length",&local_29c,(uint *)((long)&tok.start + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x78,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  local_2c4 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2c0,"2U","tok.line",&local_2c4,&tok.tokenKind);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x79,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  local_2ec = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_2e8,"1U","tok.column",&local_2ec,&tok.length);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x7a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_314 = Pipe;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_310,"ninja::Token::Kind::Pipe","tok.tokenKind",&local_314,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x7e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_320);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  local_33c = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_338,"1U","tok.length",&local_33c,(uint *)((long)&tok.start + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x7f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_348);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_348);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  local_364 = 2;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_360,"2U","tok.line",&local_364,&tok.tokenKind);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
  if (!bVar1) {
    testing::Message::Message(&local_370);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_360);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_370);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_370);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
  local_38c = 3;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_388,"3U","tok.column",&local_38c,&tok.length);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x81,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  llbuild::ninja::Lexer::lex((Lexer *)local_58,(Token *)&gtest_ar.message_);
  local_3b4 = EndOfFile;
  testing::internal::EqHelper::
  Compare<llbuild::ninja::Token::Kind,_llbuild::ninja::Token::Kind,_nullptr>
            ((EqHelper *)local_3b0,"ninja::Token::Kind::EndOfFile","tok.tokenKind",&local_3b4,
             (Kind *)&tok);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Ninja/LexerTest.cpp"
               ,0x85,pcVar3);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  llbuild::ninja::Lexer::~Lexer((Lexer *)local_58);
  return;
}

Assistant:

TEST(LexerTest, indentation) {
  StringRef input = "\
|\n\
 | |";
  ninja::Lexer lexer(input);

  // Check that we get an indentation token for whitespace, but only at the
  // start of a line.
  ninja::Token tok;
  lexer.lex(tok);

  // Check first token.
  EXPECT_EQ(ninja::Token::Kind::Pipe, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(1U, tok.line);
  EXPECT_EQ(0U, tok.column);

  // Check second token (the newline).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Newline, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(1U, tok.line);
  EXPECT_EQ(1U, tok.column);

  // Check third token (our indentation token).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Indentation, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(2U, tok.line);
  EXPECT_EQ(0U, tok.column);

  // Check fourth token (the pipe following indentation).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Pipe, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(2U, tok.line);
  EXPECT_EQ(1U, tok.column);

  // Check fifth token (skipping whitespace).
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::Pipe, tok.tokenKind);
  EXPECT_EQ(1U, tok.length);
  EXPECT_EQ(2U, tok.line);
  EXPECT_EQ(3U, tok.column);

  // Check final token.
  lexer.lex(tok);
  EXPECT_EQ(ninja::Token::Kind::EndOfFile, tok.tokenKind);
}